

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semicircle.hpp
# Opt level: O0

bool __thiscall
boost::geometry::model::
semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>::
intersects_box<boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
          (semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
           *this,box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_> *b
          )

{
  bool bVar1;
  point<double,_2UL,_boost::geometry::cs::cartesian> *ppVar2;
  type local_70;
  type local_68;
  type local_60;
  type local_58;
  point<double,_2UL,_boost::geometry::cs::cartesian> local_50;
  undefined1 local_40 [8];
  BoxSegment bs;
  box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_> *b_local;
  semicircle<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
  *this_local;
  
  bs.
  super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
  .second.m_values[1] = (double)b;
  bVar1 = intersects<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>,boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                    ((segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                      *)this,b);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    ppVar2 = box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>::
             min_corner((box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                         *)bs.
                           super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                           .second.m_values[1]);
    local_58 = get<0ul,0ul,boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                         ((box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                           *)bs.
                             super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                             .second.m_values[1],(signature_getset_index_dimension *)0x0);
    local_60 = get<1ul,1ul,boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                         ((box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                           *)bs.
                             super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                             .second.m_values[1],(signature_getset_index_dimension *)0x0);
    point<double,_2UL,_boost::geometry::cs::cartesian>::point(&local_50,&local_58,&local_60);
    segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>::segment
              ((segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                *)local_40,ppVar2,&local_50);
    bVar1 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                      (this,(segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                             *)local_40);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      ppVar2 = box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>::
               max_corner((box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                           *)bs.
                             super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                             .second.m_values[1]);
      local_40 = (undefined1  [8])ppVar2->m_values[0];
      bs.
      super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
      .first.m_values[0] = ppVar2->m_values[1];
      bVar1 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                        (this,(segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                               *)local_40);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        local_68 = get<1ul,0ul,boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                             ((box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                               *)bs.
                                 super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                                 .second.m_values[1],(signature_getset_index_dimension *)0x0);
        set<0ul,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
                  ((point<double,_2UL,_boost::geometry::cs::cartesian> *)
                   (bs.
                    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                    .first.m_values + 1),&local_68,(signature_getset_dimension *)0x0);
        local_70 = get<0ul,1ul,boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                             ((box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                               *)bs.
                                 super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                                 .second.m_values[1],(signature_getset_index_dimension *)0x0);
        set<1ul,boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
                  ((point<double,_2UL,_boost::geometry::cs::cartesian> *)
                   (bs.
                    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                    .first.m_values + 1),&local_70,(signature_getset_dimension *)0x0);
        bVar1 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                          (this,(segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                                 *)local_40);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          ppVar2 = box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                   ::min_corner((box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                                 *)bs.
                                   super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                                   .second.m_values[1]);
          local_40 = (undefined1  [8])ppVar2->m_values[0];
          bs.
          super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
          .first.m_values[0] = ppVar2->m_values[1];
          bVar1 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                            (this,(segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
                                   *)local_40);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool intersects_box(Box const &b) const
    {
        if (geometry::intersects(s, b))
            return true;
        typedef typename point_type<Box>::type BoxPoint;
        typedef segment<BoxPoint> BoxSegment;
        BoxSegment bs(b.min_corner(),
                        BoxPoint(get<min_corner, 0>(b), get<max_corner, 1>(b)));
        if (intersects_segment(bs))
            return true;
        bs.first = b.max_corner();
        if (intersects_segment(bs))
            return true;
        set<0>(bs.second, get<max_corner, 0>(b));
        set<1>(bs.second, get<min_corner, 1>(b));
        if (intersects_segment(bs))
            return true;
        bs.first = b.min_corner();
        if (intersects_segment(bs))
            return true;
        return false;
    }